

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error appendAttributeValue
                    (XML_Parser parser,ENCODING *enc,int isCdata,char *ptr,char *end,
                    STRING_POOL *pool)

{
  XML_Char XVar1;
  char *ptr_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  XML_Error XVar5;
  char *pcVar6;
  XML_Char *pXVar7;
  NAMED *pNVar8;
  ulong uVar9;
  char *next;
  XML_Parser local_58;
  XML_Char buf [4];
  
  local_58 = parser;
LAB_0014e321:
  pcVar6 = ptr;
  iVar2 = (*enc->literalScanners[0])(enc,pcVar6,end,&next);
  switch(iVar2) {
  case 0:
    if (*(ENCODING **)((long)local_58 + 0x118) == enc) {
      *(char **)((long)local_58 + 0x218) = next;
      return XML_ERROR_INVALID_TOKEN;
    }
    return XML_ERROR_INVALID_TOKEN;
  case 6:
    pXVar7 = poolAppend(pool,enc,pcVar6,next);
    ptr = next;
    if (pXVar7 == (XML_Char *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
    goto LAB_0014e321;
  case 7:
    break;
  case 9:
    iVar2 = (*enc->predefinedEntityName)
                      (enc,pcVar6 + enc->minBytesPerChar,next + -(long)enc->minBytesPerChar);
    if ((char)iVar2 == '\0') {
      pXVar7 = poolStoreString((STRING_POOL *)((long)parser + 0x448),enc,
                               pcVar6 + enc->minBytesPerChar,next + -(long)enc->minBytesPerChar);
      if (pXVar7 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      pNVar8 = lookup((HASH_TABLE *)((long)parser + 0x290),pXVar7,0);
      *(undefined8 *)((long)local_58 + 0x460) = *(undefined8 *)((long)local_58 + 0x468);
      if (pNVar8 == (NAMED *)0x0) goto LAB_0014e575;
      if (*(char *)&pNVar8[7].name != '\0') {
        XVar5 = XML_ERROR_RECURSIVE_ENTITY_REF;
        goto LAB_0014e5de;
      }
      if (pNVar8[6].name != (KEY)0x0) {
        XVar5 = XML_ERROR_BINARY_ENTITY_REF;
        goto LAB_0014e5de;
      }
      ptr_00 = pNVar8[1].name;
      if (ptr_00 == (char *)0x0) {
        XVar5 = XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF;
        goto LAB_0014e5de;
      }
      *(undefined1 *)&pNVar8[7].name = 1;
      XVar5 = appendAttributeValue
                        (local_58,*(ENCODING **)((long)local_58 + 0x1b8),isCdata,ptr_00,
                         ptr_00 + *(int *)&pNVar8[2].name,pool);
      *(undefined1 *)&pNVar8[7].name = 0;
      ptr = next;
      if (XVar5 != XML_ERROR_NONE) {
        return XVar5;
      }
    }
    else {
      pcVar6 = pool->ptr;
      if (pcVar6 == pool->end) {
        iVar3 = poolGrow(pool);
        if (iVar3 == 0) {
          return XML_ERROR_NO_MEMORY;
        }
        pcVar6 = pool->ptr;
      }
      pool->ptr = pcVar6 + 1;
      *pcVar6 = (char)iVar2;
      ptr = next;
    }
    goto LAB_0014e321;
  case 10:
    iVar2 = (*enc->charRefNumber)(enc,pcVar6);
    if (-1 < iVar2) {
      if ((iVar2 == 0x20 && isCdata == 0) &&
         ((ptr = next, pool->ptr == pool->start || (ptr = next, pool->ptr[-1] == ' '))))
      goto LAB_0014e321;
      uVar4 = cm_expat_XmlUtf8Encode(iVar2,buf);
      if (uVar4 != 0) {
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        for (uVar9 = 0; ptr = next, uVar4 != uVar9; uVar9 = uVar9 + 1) {
          pXVar7 = pool->ptr;
          if (pXVar7 == pool->end) {
            iVar2 = poolGrow(pool);
            if (iVar2 == 0) {
              return XML_ERROR_NO_MEMORY;
            }
            pXVar7 = pool->ptr;
          }
          XVar1 = buf[uVar9];
          pool->ptr = pXVar7 + 1;
          *pXVar7 = XVar1;
        }
        goto LAB_0014e321;
      }
    }
    if (*(ENCODING **)((long)local_58 + 0x118) == enc) {
      *(char **)((long)local_58 + 0x218) = pcVar6;
      return XML_ERROR_BAD_CHAR_REF;
    }
    return XML_ERROR_BAD_CHAR_REF;
  case -4:
    return XML_ERROR_NONE;
  case -3:
    next = pcVar6 + enc->minBytesPerChar;
    break;
  case -2:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 8:
switchD_0014e347_caseD_fffffffe:
    XVar5 = XML_ERROR_UNEXPECTED_STATE;
    goto LAB_0014e5de;
  case -1:
    XVar5 = XML_ERROR_INVALID_TOKEN;
    goto LAB_0014e5de;
  default:
    if (iVar2 != 0x27) goto switchD_0014e347_caseD_fffffffe;
  }
  pXVar7 = pool->ptr;
  if ((isCdata != 0) || ((ptr = next, pXVar7 != pool->start && (ptr = next, pXVar7[-1] != ' ')))) {
    if (pXVar7 == pool->end) {
      iVar2 = poolGrow(pool);
      if (iVar2 == 0) {
        return XML_ERROR_NO_MEMORY;
      }
      pXVar7 = pool->ptr;
    }
    pool->ptr = pXVar7 + 1;
    *pXVar7 = ' ';
    ptr = next;
  }
  goto LAB_0014e321;
LAB_0014e575:
  ptr = next;
  if (*(int *)((long)local_58 + 0x360) != 0) {
    XVar5 = XML_ERROR_UNDEFINED_ENTITY;
LAB_0014e5de:
    if (*(ENCODING **)((long)local_58 + 0x118) == enc) {
      *(char **)((long)local_58 + 0x218) = pcVar6;
    }
    return XVar5;
  }
  goto LAB_0014e321;
}

Assistant:

static enum XML_Error
appendAttributeValue(XML_Parser parser, const ENCODING *enc, int isCdata,
                     const char *ptr, const char *end,
                     STRING_POOL *pool)
{
  for (;;) {
    const char *next;
    int tok = XmlAttributeValueTok(enc, ptr, end, &next);
    switch (tok) {
    case XML_TOK_NONE:
      return XML_ERROR_NONE;
    case XML_TOK_INVALID:
      if (enc == encoding)
        eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (enc == encoding)
        eventPtr = ptr;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_CHAR_REF:
      {
        XML_Char buf[XML_ENCODE_MAX];
        int i;
        int n = XmlCharRefNumber(enc, ptr);
        if (n < 0) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        if (!isCdata
            && n == 0x20 /* space */
            && (poolLength(pool) == 0 || poolLastChar(pool) == 0x20))
          break;
        n = XmlEncode(n, (ICHAR *)buf);
        if (!n) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        for (i = 0; i < n; i++) {
          if (!poolAppendChar(pool, buf[i]))
            return XML_ERROR_NO_MEMORY;
        }
      }
      break;
    case XML_TOK_DATA_CHARS:
      if (!poolAppend(pool, enc, ptr, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_TRAILING_CR:
      next = ptr + enc->minBytesPerChar;
      /* fall through */
    case XML_TOK_ATTRIBUTE_VALUE_S:
    case XML_TOK_DATA_NEWLINE:
      if (!isCdata && (poolLength(pool) == 0 || poolLastChar(pool) == 0x20))
        break;
      if (!poolAppendChar(pool, 0x20))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_ENTITY_REF:
      {
        const XML_Char *name;
        ENTITY *entity;
        XML_Char ch = XmlPredefinedEntityName(enc,
                                              ptr + enc->minBytesPerChar,
                                              next - enc->minBytesPerChar);
        if (ch) {
          if (!poolAppendChar(pool, ch))
            return XML_ERROR_NO_MEMORY;
          break;
        }
        name = poolStoreString(&temp2Pool, enc,
                               ptr + enc->minBytesPerChar,
                               next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(&dtd.generalEntities, name, 0);
        poolDiscard(&temp2Pool);
        if (!entity) {
          if (dtd.complete) {
            if (enc == encoding)
              eventPtr = ptr;
            return XML_ERROR_UNDEFINED_ENTITY;
          }
        }
        else if (entity->open) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        }
        else if (entity->notation) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_BINARY_ENTITY_REF;
        }
        else if (!entity->textPtr) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF;
        }
        else {
          enum XML_Error result;
          const XML_Char *textEnd = entity->textPtr + entity->textLen;
          entity->open = 1;
          result = appendAttributeValue(parser, internalEncoding, isCdata, (char *)entity->textPtr, (char *)textEnd, pool);
          entity->open = 0;
          if (result)
            return result;
        }
      }
      break;
    default:
      if (enc == encoding)
        eventPtr = ptr;
      return XML_ERROR_UNEXPECTED_STATE;
    }
    ptr = next;
  }
  /* not reached */
}